

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O3

int evthread_set_lock_callbacks(evthread_lock_callbacks *cbs)

{
  _func_void_ptr_uint *p_Var1;
  _func_int_uint_void_ptr *p_Var2;
  uint uVar3;
  int iVar4;
  evthread_lock_callbacks *peVar5;
  evthread_lock_callbacks *peVar6;
  evthread_lock_callbacks *peVar7;
  
  peVar5 = &original_lock_fns_;
  peVar6 = &original_lock_fns_;
  if (evthread_lock_debugging_enabled_ == 0) {
    peVar6 = &evthread_lock_fns_;
  }
  if ((event_debug_mode_on_ != 0) && (event_debug_created_threadable_ctx_ != 0)) {
    event_errx(1,"evthread initialization must be called BEFORE anything else!");
  }
  peVar7 = &original_lock_fns_;
  if (evthread_lock_debugging_enabled_ == 0) {
    peVar7 = &evthread_lock_fns_;
  }
  p_Var1 = peVar7->alloc;
  if (cbs == (evthread_lock_callbacks *)0x0) {
    if (p_Var1 != (_func_void_ptr_uint *)0x0) {
      event_warnx(
                 "Trying to disable lock functions after they have been set up will probaby not work."
                 );
    }
    peVar6->free = (_func_void_void_ptr_uint *)0x0;
    peVar6->lock = (_func_int_uint_void_ptr *)0x0;
    peVar6->lock_api_version = 0;
    peVar6->supported_locktypes = 0;
    peVar6->alloc = (_func_void_ptr_uint *)0x0;
    peVar6->unlock = (_func_int_uint_void_ptr *)0x0;
LAB_002d2459:
    iVar4 = 0;
  }
  else {
    if (p_Var1 == (_func_void_ptr_uint *)0x0) {
      if (cbs->alloc == (_func_void_ptr_uint *)0x0) {
        return -1;
      }
      if (cbs->free == (_func_void_void_ptr_uint *)0x0) {
        return -1;
      }
      if (cbs->lock == (_func_int_uint_void_ptr *)0x0) {
        return -1;
      }
      if (cbs->unlock == (_func_int_uint_void_ptr *)0x0) {
        return -1;
      }
      peVar6->unlock = cbs->unlock;
      iVar4 = cbs->lock_api_version;
      uVar3 = cbs->supported_locktypes;
      p_Var1 = cbs->alloc;
      p_Var2 = cbs->lock;
      peVar6->free = cbs->free;
      peVar6->lock = p_Var2;
      peVar6->lock_api_version = iVar4;
      peVar6->supported_locktypes = uVar3;
      peVar6->alloc = p_Var1;
      iVar4 = event_global_setup_locks_(1);
      return iVar4;
    }
    if (peVar6->lock_api_version == cbs->lock_api_version) {
      peVar6 = &original_lock_fns_;
      if (evthread_lock_debugging_enabled_ == 0) {
        peVar6 = &evthread_lock_fns_;
      }
      if ((peVar6->supported_locktypes == cbs->supported_locktypes) && (p_Var1 == cbs->alloc)) {
        peVar6 = &original_lock_fns_;
        if (evthread_lock_debugging_enabled_ == 0) {
          peVar6 = &evthread_lock_fns_;
        }
        if (peVar6->free == cbs->free) {
          peVar6 = &original_lock_fns_;
          if (evthread_lock_debugging_enabled_ == 0) {
            peVar6 = &evthread_lock_fns_;
          }
          if (peVar6->lock == cbs->lock) {
            if (evthread_lock_debugging_enabled_ == 0) {
              peVar5 = &evthread_lock_fns_;
            }
            if (peVar5->unlock == cbs->unlock) goto LAB_002d2459;
          }
        }
      }
    }
    event_warnx("Can\'t change lock callbacks once they have been initialized.");
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int
evthread_set_lock_callbacks(const struct evthread_lock_callbacks *cbs)
{
	struct evthread_lock_callbacks *target = evthread_get_lock_callbacks();

#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_mode_on_) {
		if (event_debug_created_threadable_ctx_) {
		    event_errx(1, "evthread initialization must be called BEFORE anything else!");
		}
	}
#endif

	if (!cbs) {
		if (target->alloc)
			event_warnx("Trying to disable lock functions after "
			    "they have been set up will probaby not work.");
		memset(target, 0, sizeof(evthread_lock_fns_));
		return 0;
	}
	if (target->alloc) {
		/* Uh oh; we already had locking callbacks set up.*/
		if (target->lock_api_version == cbs->lock_api_version &&
			target->supported_locktypes == cbs->supported_locktypes &&
			target->alloc == cbs->alloc &&
			target->free == cbs->free &&
			target->lock == cbs->lock &&
			target->unlock == cbs->unlock) {
			/* no change -- allow this. */
			return 0;
		}
		event_warnx("Can't change lock callbacks once they have been "
		    "initialized.");
		return -1;
	}
	if (cbs->alloc && cbs->free && cbs->lock && cbs->unlock) {
		memcpy(target, cbs, sizeof(evthread_lock_fns_));
		return event_global_setup_locks_(1);
	} else {
		return -1;
	}
}